

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O2

ssl_open_record_t
bssl::tls_open_record
          (SSL *ssl,uint8_t *out_type,Span<unsigned_char> *out,size_t *out_consumed,
          uint8_t *out_alert,Span<unsigned_char> in)

{
  Span<unsigned_char> in_00;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  int iVar4;
  ssl_open_record_t sVar5;
  uchar *puVar6;
  SSL3_STATE *pSVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  size_t in_R9;
  Span<unsigned_char> SVar11;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  uint8_t type;
  uint16_t ciphertext_len;
  uint16_t version;
  CBS cbs;
  CBS body;
  
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }
  bVar1 = tls_can_accept_handshake_data(ssl,out_alert);
  if (!bVar1) {
    return ssl_open_record_error;
  }
  cbs.data = in.data_;
  cbs.len = in.size_;
  iVar4 = CBS_get_u8(&cbs,&type);
  if (((iVar4 == 0) || (iVar4 = CBS_get_u16(&cbs,&version), iVar4 == 0)) ||
     (iVar4 = CBS_get_u16(&cbs,&ciphertext_len), uVar3 = version, iVar4 == 0)) {
    *out_consumed = 5;
    return ssl_open_record_partial;
  }
  if (((ssl->s3->aead_read_ctx)._M_t.
       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
      (SSL_CIPHER *)0x0) {
    if ((version & 0xff00) != 0x300) goto LAB_0023d0a2;
  }
  else {
    uVar2 = tls_record_version(ssl);
    if (uVar3 != uVar2) {
LAB_0023d0a2:
      ERR_put_error(0x10,0,0xf7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x7f);
      *out_alert = 'F';
      return ssl_open_record_error;
    }
  }
  if (0x4140 < (ulong)ciphertext_len) {
    iVar4 = 0x92;
    iVar10 = 0x86;
    goto LAB_0023d07f;
  }
  iVar4 = CBS_get_bytes(&cbs,&body,(ulong)ciphertext_len);
  if (iVar4 == 0) {
    *out_consumed = (ulong)ciphertext_len + 5;
    return ssl_open_record_partial;
  }
  SVar11 = Span<unsigned_char>::subspan(&in,0,5);
  in_01.size_ = in_R9;
  in_01.data_ = (uchar *)SVar11.size_;
  ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x100,(int)SVar11.data_,in_01);
  *out_consumed = in.size_ - cbs.len;
  bVar1 = ssl_has_final_version(ssl);
  if (((bVar1) && (uVar3 = ssl_protocol_version(ssl), 0x303 < uVar3)) &&
     ((iVar4 = SSL_in_init(ssl), iVar4 != 0 &&
      ((type == '\x14' &&
       (bVar1 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                          (body.data,body.data + body.len,"\x01",
                           (uchar *)
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                          ), bVar1)))))) {
    bVar8 = ssl->s3->empty_record_count + 1;
    ssl->s3->empty_record_count = bVar8;
    if (bVar8 < 0x21) {
      return ssl_open_record_discard;
    }
    iVar4 = 0xdb;
    iVar10 = 0x9f;
    goto LAB_0023d416;
  }
  pSVar7 = ssl->s3;
  if (((pSVar7->field_0xdc & 1) != 0) &&
     ((((pSVar7->aead_read_ctx)._M_t.
        super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
       (SSL_CIPHER *)0x0 && (type == '\x17')))) {
LAB_0023d329:
    sVar5 = skip_early_data(ssl,out_alert,*out_consumed);
    return sVar5;
  }
  if (pSVar7->read_sequence == 0xffffffffffffffff) {
    ERR_put_error(0x10,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                  ,0xb0);
    *out_alert = 'P';
    return ssl_open_record_error;
  }
  in_00.size_ = body.len;
  in_00.data_ = body.data;
  bVar1 = SSLAEADContext::Open
                    ((pSVar7->aead_read_ctx)._M_t.
                     super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,out,type,
                     version,pSVar7->read_sequence,(Span<const_unsigned_char>)SVar11,in_00);
  pSVar7 = ssl->s3;
  if (!bVar1) {
    if (((*(ushort *)&pSVar7->field_0xdc & 1) == 0) ||
       (((pSVar7->aead_read_ctx)._M_t.
         super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
        (SSL_CIPHER *)0x0)) {
      ERR_put_error(0x10,0,0x8b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0xbe);
      *out_alert = '\x14';
      return ssl_open_record_error;
    }
    ERR_clear_error();
    goto LAB_0023d329;
  }
  *(ushort *)&pSVar7->field_0xdc = *(ushort *)&pSVar7->field_0xdc & 0xfffe;
  pSVar7 = ssl->s3;
  pSVar7->read_sequence = pSVar7->read_sequence + 1;
  if (((pSVar7->aead_read_ctx)._M_t.
       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
      (SSL_CIPHER *)0x0) {
    uVar9 = out->size_;
    if (0x4000 < uVar9) goto LAB_0023d36f;
  }
  else {
    uVar3 = ssl_protocol_version(ssl);
    uVar9 = out->size_;
    if (0x4001 - (ulong)(uVar3 < 0x304) < uVar9) {
LAB_0023d36f:
      iVar4 = 0x88;
      iVar10 = 0xcf;
LAB_0023d07f:
      ERR_put_error(0x10,0,iVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,iVar10);
      *out_alert = '\x16';
      return ssl_open_record_error;
    }
    if (0x303 < uVar3) {
      if (type != '\x17') {
        ERR_put_error(0x10,0,0xfb,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                      ,0xd7);
        *out_alert = '2';
        return ssl_open_record_error;
      }
      do {
        if (uVar9 == 0) {
          ERR_put_error(0x10,0,0x8b,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                        ,0xde);
          *out_alert = '3';
          return ssl_open_record_error;
        }
        puVar6 = Span<unsigned_char>::back(out);
        type = *puVar6;
        SVar11 = Span<unsigned_char>::subspan(out,0,out->size_ - 1);
        uVar9 = SVar11.size_;
        *out = SVar11;
      } while (type == '\0');
    }
  }
  pSVar7 = ssl->s3;
  if (uVar9 == 0) {
    bVar8 = pSVar7->empty_record_count + 1;
    pSVar7->empty_record_count = bVar8;
    if (0x20 < bVar8) {
      iVar4 = 0xdb;
      iVar10 = 0xeb;
      goto LAB_0023d416;
    }
  }
  else {
    pSVar7->empty_record_count = '\0';
  }
  if (type != '\x16') {
    if (type == '\x15') {
      in_02.size_ = uVar9;
      in_02.data_ = out->data_;
      sVar5 = ssl_process_alert(ssl,out_alert,in_02);
      return sVar5;
    }
    bVar1 = tls_has_unprocessed_handshake_data(ssl);
    if (bVar1) {
      iVar4 = 0xe1;
      iVar10 = 0xfc;
LAB_0023d416:
      ERR_put_error(0x10,0,iVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,iVar10);
      *out_alert = '\n';
      return ssl_open_record_error;
    }
    pSVar7 = ssl->s3;
  }
  pSVar7->warning_alert_count = '\0';
  *out_type = type;
  return ssl_open_record_success;
}

Assistant:

ssl_open_record_t tls_open_record(SSL *ssl, uint8_t *out_type,
                                  Span<uint8_t> *out, size_t *out_consumed,
                                  uint8_t *out_alert, Span<uint8_t> in) {
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }

  // If there is an unprocessed handshake message or we are already buffering
  // too much, stop before decrypting another handshake record.
  if (!tls_can_accept_handshake_data(ssl, out_alert)) {
    return ssl_open_record_error;
  }

  CBS cbs = CBS(in);

  // Decode the record header.
  uint8_t type;
  uint16_t version, ciphertext_len;
  if (!CBS_get_u8(&cbs, &type) ||      //
      !CBS_get_u16(&cbs, &version) ||  //
      !CBS_get_u16(&cbs, &ciphertext_len)) {
    *out_consumed = SSL3_RT_HEADER_LENGTH;
    return ssl_open_record_partial;
  }

  bool version_ok;
  if (ssl->s3->aead_read_ctx->is_null_cipher()) {
    // Only check the first byte. Enforcing beyond that can prevent decoding
    // version negotiation failure alerts.
    version_ok = (version >> 8) == SSL3_VERSION_MAJOR;
  } else {
    version_ok = version == tls_record_version(ssl);
  }

  if (!version_ok) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_VERSION_NUMBER);
    *out_alert = SSL_AD_PROTOCOL_VERSION;
    return ssl_open_record_error;
  }

  // Check the ciphertext length.
  if (ciphertext_len > SSL3_RT_MAX_ENCRYPTED_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_ENCRYPTED_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  // Extract the body.
  CBS body;
  if (!CBS_get_bytes(&cbs, &body, ciphertext_len)) {
    *out_consumed = SSL3_RT_HEADER_LENGTH + (size_t)ciphertext_len;
    return ssl_open_record_partial;
  }

  Span<const uint8_t> header = in.subspan(0, SSL3_RT_HEADER_LENGTH);
  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HEADER, header);

  *out_consumed = in.size() - CBS_len(&cbs);

  // In TLS 1.3, during the handshake, skip ChangeCipherSpec records.
  static const uint8_t kChangeCipherSpec[] = {SSL3_MT_CCS};
  if (ssl_has_final_version(ssl) &&
      ssl_protocol_version(ssl) >= TLS1_3_VERSION && SSL_in_init(ssl) &&
      type == SSL3_RT_CHANGE_CIPHER_SPEC &&
      Span<const uint8_t>(body) == kChangeCipherSpec) {
    ssl->s3->empty_record_count++;
    if (ssl->s3->empty_record_count > kMaxEmptyRecords) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_EMPTY_FRAGMENTS);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
    return ssl_open_record_discard;
  }

  // Skip early data received when expecting a second ClientHello if we rejected
  // 0RTT.
  if (ssl->s3->skip_early_data &&                  //
      ssl->s3->aead_read_ctx->is_null_cipher() &&  //
      type == SSL3_RT_APPLICATION_DATA) {
    return skip_early_data(ssl, out_alert, *out_consumed);
  }

  // Ensure the sequence number update does not overflow.
  if (ssl->s3->read_sequence + 1 == 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return ssl_open_record_error;
  }

  // Decrypt the body in-place.
  if (!ssl->s3->aead_read_ctx->Open(
          out, type, version, ssl->s3->read_sequence, header,
          Span(const_cast<uint8_t *>(CBS_data(&body)), CBS_len(&body)))) {
    if (ssl->s3->skip_early_data && !ssl->s3->aead_read_ctx->is_null_cipher()) {
      ERR_clear_error();
      return skip_early_data(ssl, out_alert, *out_consumed);
    }

    OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
    *out_alert = SSL_AD_BAD_RECORD_MAC;
    return ssl_open_record_error;
  }

  ssl->s3->skip_early_data = false;
  ssl->s3->read_sequence++;

  // TLS 1.3 hides the record type inside the encrypted data.
  bool has_padding = !ssl->s3->aead_read_ctx->is_null_cipher() &&
                     ssl_protocol_version(ssl) >= TLS1_3_VERSION;

  // If there is padding, the plaintext limit includes the padding, but includes
  // extra room for the inner content type.
  size_t plaintext_limit =
      has_padding ? SSL3_RT_MAX_PLAIN_LENGTH + 1 : SSL3_RT_MAX_PLAIN_LENGTH;
  if (out->size() > plaintext_limit) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  if (has_padding) {
    // The outer record type is always application_data.
    if (type != SSL3_RT_APPLICATION_DATA) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_RECORD_TYPE);
      *out_alert = SSL_AD_DECODE_ERROR;
      return ssl_open_record_error;
    }

    do {
      if (out->empty()) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
        *out_alert = SSL_AD_DECRYPT_ERROR;
        return ssl_open_record_error;
      }
      type = out->back();
      *out = out->subspan(0, out->size() - 1);
    } while (type == 0);
  }

  // Limit the number of consecutive empty records.
  if (out->empty()) {
    ssl->s3->empty_record_count++;
    if (ssl->s3->empty_record_count > kMaxEmptyRecords) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_EMPTY_FRAGMENTS);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
    // Apart from the limit, empty records are returned up to the caller. This
    // allows the caller to reject records of the wrong type.
  } else {
    ssl->s3->empty_record_count = 0;
  }

  if (type == SSL3_RT_ALERT) {
    return ssl_process_alert(ssl, out_alert, *out);
  }

  // Handshake messages may not interleave with any other record type.
  if (type != SSL3_RT_HANDSHAKE &&  //
      tls_has_unprocessed_handshake_data(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  ssl->s3->warning_alert_count = 0;

  *out_type = type;
  return ssl_open_record_success;
}